

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

void libDAI::RemoveShortLoops
               (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *P)

{
  bool bVar1;
  iterator this;
  iterator ns;
  size_type sVar2;
  pointer pTVar3;
  ostream *poVar4;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_RDI;
  iterator J;
  iterator I;
  bool found;
  ostream *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  reference in_stack_ffffffffffffff48;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  const_iterator in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  TFactor<double> *in_stack_ffffffffffffff98;
  TFactor<double> *in_stack_ffffffffffffffa0;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_20;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_18;
  byte local_9;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *local_8;
  
  local_9 = 1;
  local_8 = in_RDI;
  do {
    if ((local_9 & 1) == 0) {
      return;
    }
    local_9 = 0;
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::__normal_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::__normal_iterator(&local_20);
    this = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                     ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                      in_stack_ffffffffffffff38);
    local_18._M_current = this._M_current;
    while( true ) {
      ns = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                     ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                      in_stack_ffffffffffffff38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar1) break;
      local_20._M_current = local_18._M_current;
      __gnu_cxx::
      __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
      ::operator++((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                    *)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      while( true ) {
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   in_stack_ffffffffffffff38);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                            *)in_stack_ffffffffffffff40,
                           (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                            *)in_stack_ffffffffffffff38);
        if (!bVar1) break;
        pTVar3 = __gnu_cxx::
                 __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                 ::operator->(&local_18);
        in_stack_ffffffffffffff58._M_current = (TFactor<double> *)TFactor<double>::vars(pTVar3);
        pTVar3 = __gnu_cxx::
                 __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                 ::operator->(&local_20);
        TFactor<double>::vars(pTVar3);
        in_stack_ffffffffffffff60 = (ostream *)&stack0xffffffffffffffa0;
        VarSet::operator&(&(this._M_current)->_vs,&(ns._M_current)->_vs);
        sVar2 = VarSet::size((VarSet *)0xb3cba9);
        VarSet::~VarSet((VarSet *)0xb3cbba);
        if (1 < sVar2) {
          local_9 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
        ::operator++((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                      *)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      }
      if ((local_9 & 1) != 0) break;
      __gnu_cxx::
      __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
      ::operator++((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                    *)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    }
    if ((local_9 & 1) != 0) {
      in_stack_ffffffffffffff38 = std::operator<<((ostream *)&std::cout,"Merging factors ");
      pTVar3 = __gnu_cxx::
               __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator->(&local_18);
      TFactor<double>::vars(pTVar3);
      poVar4 = operator<<(in_stack_ffffffffffffff60,&(in_stack_ffffffffffffff58._M_current)->_vs);
      in_stack_ffffffffffffff40 = std::operator<<(poVar4," and ");
      pTVar3 = __gnu_cxx::
               __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator->(&local_20);
      TFactor<double>::vars(pTVar3);
      poVar4 = operator<<(in_stack_ffffffffffffff60,&(in_stack_ffffffffffffff58._M_current)->_vs);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      in_stack_ffffffffffffff48 =
           __gnu_cxx::
           __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
           ::operator*(&local_20);
      __gnu_cxx::
      __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
      ::operator*(&local_18);
      TFactor<double>::operator*=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      this_00 = local_8;
      __gnu_cxx::
      __normal_iterator<libDAI::TFactor<double>const*,std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>>
      ::__normal_iterator<libDAI::TFactor<double>*>
                ((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                  *)in_stack_ffffffffffffff40,
                 (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                  *)in_stack_ffffffffffffff38);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::erase
                (this_00,in_stack_ffffffffffffff58);
    }
  } while( true );
}

Assistant:

void RemoveShortLoops(std::vector<Factor> &P) {
        bool found = true;
        while( found ) {
            found = false;
            vector<Factor>::iterator I, J;
            for( I = P.begin(); I != P.end(); I++ ) {
                J = I;
                J++;
                for( ; J != P.end(); J++ )
                    if( (I->vars() & J->vars()).size() >= 2 ) {
                        found = true;
                        break;
                    }
                if( found )
                    break;
            }
            if( found ) {
                cout << "Merging factors " << I->vars() << " and " << J->vars() << endl;
                *I *= *J;
                P.erase(J);
            }
        }
    }